

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data_local;
  OpCode op_local;
  
  DumpReg(data->R0);
  DumpReg(data->R1);
  DumpReg(data->R2);
  DumpReg(data->R3);
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg4(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpReg(data->R3);
    }